

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

int luaL_execresult(lua_State *L,int stat)

{
  int iVar1;
  
  if (stat == 0) {
    lua_pushboolean(L,1);
  }
  else {
    if (stat == -1) {
      iVar1 = luaL_fileresult(L,0,(char *)0x0);
      return iVar1;
    }
    lua_pushnil(L);
  }
  lua_pushstring(L,"exit");
  lua_pushinteger(L,(long)stat);
  return 3;
}

Assistant:

LUALIB_API int luaL_execresult (lua_State *L, int stat) {
  const char *what = "exit";  /* type of termination */
  if (stat == -1)  /* error? */
    return luaL_fileresult(L, 0, NULL);
  else {
    inspectstat(stat, what);  /* interpret result */
    if (*what == 'e' && stat == 0)  /* successful termination? */
      lua_pushboolean(L, 1);
    else
      lua_pushnil(L);
    lua_pushstring(L, what);
    lua_pushinteger(L, stat);
    return 3;  /* return true/nil,what,code */
  }
}